

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_ext_substmt(lysp_yang_ctx *ctx,ly_stmt kw,char *word,size_t word_len,lysp_stmt **child)

{
  lysp_stmt *plVar1;
  LY_ERR LVar2;
  lysp_stmt *str_p;
  lysp_stmt *plVar3;
  char *pcVar4;
  ly_ctx *plVar5;
  bool bVar6;
  ly_stmt child_kw;
  char *buf;
  ly_stmt local_4c;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  local_48 = word_len;
  local_40 = word;
  str_p = (lysp_stmt *)calloc(1,0x38);
  if (str_p == (lysp_stmt *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_ext_substmt");
    LVar2 = LY_EMEM;
  }
  else {
    plVar1 = *child;
    if (*child != (lysp_stmt *)0x0) {
      do {
        plVar3 = plVar1;
        plVar1 = plVar3->next;
      } while (plVar1 != (lysp_stmt *)0x0);
      child = &plVar3->next;
    }
    *child = str_p;
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = lydict_insert(plVar5,word,word_len,(char **)str_p);
    if ((LVar2 == LY_SUCCESS) &&
       (LVar2 = get_argument(ctx,Y_MAYBE_STR_ARG,&str_p->flags,&local_40,&local_38,&local_48),
       LVar2 == LY_SUCCESS)) {
      if (local_40 != (char *)0x0) {
        if (local_38 == (char *)0x0) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar5 = (ly_ctx *)0x0;
          }
          else {
            plVar5 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = local_40;
          if (local_48 == 0) {
            pcVar4 = "";
          }
          LVar2 = lydict_insert(plVar5,pcVar4,local_48,&str_p->arg);
        }
        else {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar5 = (ly_ctx *)0x0;
          }
          else {
            plVar5 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          LVar2 = lydict_insert_zc(plVar5,local_40,&str_p->arg);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      str_p->format = LY_VALUE_SCHEMA;
      str_p->prefix_data = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      str_p->kw = kw;
      LVar2 = get_keyword(ctx,&local_4c,&local_40,&local_48);
      if (LVar2 == LY_SUCCESS) {
        if (local_4c == LY_STMT_SYNTAX_SEMICOLON) {
          bVar6 = true;
        }
        else {
          if (local_4c != LY_STMT_SYNTAX_LEFT_BRACE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar5 = (ly_ctx *)0x0;
            }
            else {
              plVar5 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar4 = lyplg_ext_stmt2str(local_4c);
            ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
            return LY_EVALID;
          }
          LVar2 = get_keyword(ctx,&local_4c,&local_40,&local_48);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar6 = local_4c == LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        LVar2 = LY_SUCCESS;
        if (!bVar6) {
          do {
            LVar2 = parse_ext_substmt(ctx,local_4c,local_40,local_48,&str_p->child);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            LVar2 = get_keyword(ctx,&local_4c,&local_40,&local_48);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            if (local_4c == LY_STMT_SYNTAX_RIGHT_BRACE) {
              bVar6 = true;
            }
            LVar2 = LY_SUCCESS;
          } while (!bVar6);
        }
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
parse_ext_substmt(struct lysp_yang_ctx *ctx, enum ly_stmt kw, char *word, size_t word_len,
        struct lysp_stmt **child)
{
    char *buf;
    LY_ERR ret = LY_SUCCESS;
    enum ly_stmt child_kw;
    struct lysp_stmt *stmt, *par_child;

    stmt = calloc(1, sizeof *stmt);
    LY_CHECK_ERR_RET(!stmt, LOGMEM(NULL), LY_EMEM);

    /* insert into parent statements */
    if (!*child) {
        *child = stmt;
    } else {
        for (par_child = *child; par_child->next; par_child = par_child->next) {}
        par_child->next = stmt;
    }

    /* statement */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), word, word_len, &stmt->stmt));

    /* get optional argument */
    LY_CHECK_RET(get_argument(ctx, Y_MAYBE_STR_ARG, &stmt->flags, &word, &buf, &word_len));
    if (word) {
        INSERT_WORD_GOTO(ctx, buf, stmt->arg, word, word_len, ret, cleanup);
    }

    stmt->format = LY_VALUE_SCHEMA;
    stmt->prefix_data = PARSER_CUR_PMOD(ctx);
    stmt->kw = kw;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, child_kw, word, word_len, ret, cleanup) {
        LY_CHECK_GOTO(ret = parse_ext_substmt(ctx, child_kw, word, word_len, &stmt->child), cleanup)
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, child_kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}